

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall cnn::Model::~Model(Model *this)

{
  pointer ppPVar1;
  pointer ppLVar2;
  pointer ppPVar3;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  pointer ppPVar4;
  
  ppPVar1 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar4 = (this->all_params).
                 super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppPVar4 != ppPVar1; ppPVar4 = ppPVar4 + 1
      ) {
    if (*ppPVar4 != (ParametersBase *)0x0) {
      (*(*ppPVar4)->_vptr_ParametersBase[5])();
    }
  }
  ppLVar2 = (this->lookup_params).
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar2 != (pointer)0x0) {
    operator_delete(ppLVar2);
  }
  ppPVar3 = (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar3 != (pointer)0x0) {
    operator_delete(ppPVar3);
  }
  ppPVar4 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar4 != (pointer)0x0) {
    operator_delete(ppPVar4);
    return;
  }
  return;
}

Assistant:

Model::~Model() {
  for (auto p : all_params) delete p;
}